

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_strategy.cpp
# Opt level: O0

FUNCTION_RETURN
license::hw_identifier::generate_disk_pc_id
          (vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
           *v_disk_id)

{
  ulong uVar1;
  pointer this;
  array<unsigned_char,_7UL> aVar2;
  size_type sVar3;
  reference pvVar4;
  value_type local_66;
  undefined1 uStack_5f;
  array<unsigned_char,_7UL> l_disk_id;
  array<unsigned_char,_7UL> a_disk_id;
  size_t i;
  bool preferred;
  int j;
  undefined1 local_30 [4];
  FUNCTION_RETURN result_diskinfos;
  vector<DiskInfo,_std::allocator<DiskInfo>_> disk_infos;
  vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
  *v_disk_id_local;
  
  disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)v_disk_id;
  std::vector<DiskInfo,_std::allocator<DiskInfo>_>::vector
            ((vector<DiskInfo,_std::allocator<DiskInfo>_> *)local_30);
  v_disk_id_local._4_4_ = getDiskInfos((vector<DiskInfo,_std::allocator<DiskInfo>_> *)local_30);
  if (v_disk_id_local._4_4_ == FUNC_RET_OK) {
    sVar3 = std::vector<DiskInfo,_std::allocator<DiskInfo>_>::size
                      ((vector<DiskInfo,_std::allocator<DiskInfo>_> *)local_30);
    this = disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
    if (sVar3 == 0) {
      v_disk_id_local._4_4_ = FUNC_RET_NOT_AVAIL;
    }
    else {
      sVar3 = std::vector<DiskInfo,_std::allocator<DiskInfo>_>::size
                        ((vector<DiskInfo,_std::allocator<DiskInfo>_> *)local_30);
      std::vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
      ::reserve((vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                 *)this,sVar3 * 2);
      for (i._4_4_ = 0; i._4_4_ < 2; i._4_4_ = i._4_4_ + 1) {
        for (stack0xffffffffffffffa8 = 0; uVar1 = stack0xffffffffffffffa8,
            sVar3 = std::vector<DiskInfo,_std::allocator<DiskInfo>_>::size
                              ((vector<DiskInfo,_std::allocator<DiskInfo>_> *)local_30),
            uVar1 < sVar3; register0x00000000 = stack0xffffffffffffffa8 + 1) {
          pvVar4 = std::vector<DiskInfo,_std::allocator<DiskInfo>_>::operator[]
                             ((vector<DiskInfo,_std::allocator<DiskInfo>_> *)local_30,
                              stack0xffffffffffffffa8);
          if ((bool)(pvVar4->preferred & 1U) == (i._4_4_ == 0)) {
            pvVar4 = std::vector<DiskInfo,_std::allocator<DiskInfo>_>::operator[]
                               ((vector<DiskInfo,_std::allocator<DiskInfo>_> *)local_30,
                                stack0xffffffffffffffa8);
            if ((pvVar4->sn_initialized & 1U) != 0) {
              pvVar4 = std::vector<DiskInfo,_std::allocator<DiskInfo>_>::operator[]
                                 ((vector<DiskInfo,_std::allocator<DiskInfo>_> *)local_30,
                                  stack0xffffffffffffffa8);
              aVar2 = generate_id_by_sn(pvVar4);
              l_disk_id._M_elems[5] = aVar2._M_elems[6];
              l_disk_id._M_elems._3_2_ = aVar2._M_elems._4_2_;
              _uStack_5f = aVar2._M_elems._0_4_;
              std::
              vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
              ::push_back((vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                           *)disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (value_type *)&uStack_5f);
            }
            pvVar4 = std::vector<DiskInfo,_std::allocator<DiskInfo>_>::operator[]
                               ((vector<DiskInfo,_std::allocator<DiskInfo>_> *)local_30,
                                stack0xffffffffffffffa8);
            if ((pvVar4->label_initialized & 1U) != 0) {
              pvVar4 = std::vector<DiskInfo,_std::allocator<DiskInfo>_>::operator[]
                                 ((vector<DiskInfo,_std::allocator<DiskInfo>_> *)local_30,
                                  stack0xffffffffffffffa8);
              aVar2 = generate_id_by_label(pvVar4);
              local_66._M_elems[6] = aVar2._M_elems[6];
              local_66._M_elems._4_2_ = aVar2._M_elems._4_2_;
              local_66._M_elems._0_4_ = aVar2._M_elems._0_4_;
              std::
              vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
              ::push_back((vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                           *)disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,&local_66);
            }
          }
        }
      }
      sVar3 = std::
              vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
              ::size((vector<std::array<unsigned_char,_7UL>,_std::allocator<std::array<unsigned_char,_7UL>_>_>
                      *)disk_infos.super__Vector_base<DiskInfo,_std::allocator<DiskInfo>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      v_disk_id_local._4_4_ = (FUNCTION_RETURN)(sVar3 == 0);
    }
  }
  std::vector<DiskInfo,_std::allocator<DiskInfo>_>::~vector
            ((vector<DiskInfo,_std::allocator<DiskInfo>_> *)local_30);
  return v_disk_id_local._4_4_;
}

Assistant:

static FUNCTION_RETURN generate_disk_pc_id(vector<array<uint8_t, HW_IDENTIFIER_PROPRIETARY_DATA>> &v_disk_id) {
	std::vector<DiskInfo> disk_infos;
	FUNCTION_RETURN result_diskinfos = getDiskInfos(disk_infos);
	if (result_diskinfos != FUNC_RET_OK) {
		return result_diskinfos;
	}
	if (disk_infos.size() == 0) {
		return FUNC_RET_NOT_AVAIL;
	}

	v_disk_id.reserve(disk_infos.size() * 2);
	for (int j = 0; j < 2; j++) {
		bool preferred = (j == 0);
		for (size_t i = 0; i < disk_infos.size(); i++) {
			if (disk_infos[i].preferred == preferred) {
				if (disk_infos[i].sn_initialized) {
					array<uint8_t, HW_IDENTIFIER_PROPRIETARY_DATA> a_disk_id = generate_id_by_sn(disk_infos[i]);
					v_disk_id.push_back(a_disk_id);
				}
				if (disk_infos[i].label_initialized) {
					array<uint8_t, HW_IDENTIFIER_PROPRIETARY_DATA> l_disk_id = generate_id_by_label(disk_infos[i]);
					v_disk_id.push_back(l_disk_id);
				}
			}
		}
	}
	return v_disk_id.size() > 0 ? FUNC_RET_OK : FUNC_RET_NOT_AVAIL;
}